

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBvhTriangleMeshShape.cpp
# Opt level: O3

char * __thiscall
btBvhTriangleMeshShape::serialize
          (btBvhTriangleMeshShape *this,void *dataBuffer,btSerializer *serializer)

{
  btStridingMeshInterface *pbVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  undefined8 uVar5;
  
  btCollisionShape::serialize((btCollisionShape *)this,dataBuffer,serializer);
  pbVar1 = (this->super_btTriangleMeshShape).m_meshInterface;
  (*pbVar1->_vptr_btStridingMeshInterface[0xe])(pbVar1,(long)dataBuffer + 0x10,serializer);
  *(undefined4 *)((long)dataBuffer + 0x48) =
       *(undefined4 *)
        &(this->super_btTriangleMeshShape).super_btConcaveShape.super_btCollisionShape.field_0x1c;
  if ((this->m_bvh == (btOptimizedBvh *)0x0) ||
     (uVar3 = (**(code **)(*(long *)serializer + 0x68))(serializer), (uVar3 & 1) != 0)) {
    *(undefined8 *)((long)dataBuffer + 0x30) = 0;
    *(undefined8 *)((long)dataBuffer + 0x38) = 0;
  }
  else {
    lVar4 = (**(code **)(*(long *)serializer + 0x30))(serializer,this->m_bvh);
    if (lVar4 == 0) {
      uVar5 = (**(code **)(*(long *)serializer + 0x38))(serializer,this->m_bvh);
      *(undefined8 *)((long)dataBuffer + 0x30) = uVar5;
      *(undefined8 *)((long)dataBuffer + 0x38) = 0;
      iVar2 = (*(this->m_bvh->super_btQuantizedBvh)._vptr_btQuantizedBvh[3])();
      lVar4 = (**(code **)(*(long *)serializer + 0x20))(serializer,(long)iVar2,1);
      iVar2 = (*(this->m_bvh->super_btQuantizedBvh)._vptr_btQuantizedBvh[4])
                        (this->m_bvh,*(undefined8 *)(lVar4 + 8),serializer);
      (**(code **)(*(long *)serializer + 0x28))(serializer,lVar4,iVar2,0x48564251,this->m_bvh);
    }
    else {
      *(long *)((long)dataBuffer + 0x30) = lVar4;
      *(undefined8 *)((long)dataBuffer + 0x38) = 0;
    }
  }
  if ((this->m_triangleInfoMap != (btTriangleInfoMap *)0x0) &&
     (uVar3 = (**(code **)(*(long *)serializer + 0x68))(serializer), (uVar3 & 2) == 0)) {
    lVar4 = (**(code **)(*(long *)serializer + 0x30))(serializer,this->m_triangleInfoMap);
    if (lVar4 != 0) {
      *(long *)((long)dataBuffer + 0x40) = lVar4;
      return "btTriangleMeshShapeData";
    }
    uVar5 = (**(code **)(*(long *)serializer + 0x38))(serializer,this->m_triangleInfoMap);
    *(undefined8 *)((long)dataBuffer + 0x40) = uVar5;
    iVar2 = (*this->m_triangleInfoMap->_vptr_btTriangleInfoMap[2])();
    lVar4 = (**(code **)(*(long *)serializer + 0x20))(serializer,(long)iVar2,1);
    iVar2 = (*this->m_triangleInfoMap->_vptr_btTriangleInfoMap[3])
                      (this->m_triangleInfoMap,*(undefined8 *)(lVar4 + 8),serializer);
    (**(code **)(*(long *)serializer + 0x28))
              (serializer,lVar4,iVar2,0x50414d54,this->m_triangleInfoMap);
    return "btTriangleMeshShapeData";
  }
  *(undefined8 *)((long)dataBuffer + 0x40) = 0;
  return "btTriangleMeshShapeData";
}

Assistant:

const char*	btBvhTriangleMeshShape::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btTriangleMeshShapeData* trimeshData = (btTriangleMeshShapeData*) dataBuffer;

	btCollisionShape::serialize(&trimeshData->m_collisionShapeData,serializer);

	m_meshInterface->serialize(&trimeshData->m_meshInterface, serializer);

	trimeshData->m_collisionMargin = float(m_collisionMargin);

	

	if (m_bvh && !(serializer->getSerializationFlags()&BT_SERIALIZE_NO_BVH))
	{
		void* chunk = serializer->findPointer(m_bvh);
		if (chunk)
		{
#ifdef BT_USE_DOUBLE_PRECISION
			trimeshData->m_quantizedDoubleBvh = (btQuantizedBvhData*)chunk;
			trimeshData->m_quantizedFloatBvh = 0;
#else
			trimeshData->m_quantizedFloatBvh  = (btQuantizedBvhData*)chunk;
			trimeshData->m_quantizedDoubleBvh= 0;
#endif //BT_USE_DOUBLE_PRECISION
		} else
		{

#ifdef BT_USE_DOUBLE_PRECISION
			trimeshData->m_quantizedDoubleBvh = (btQuantizedBvhData*)serializer->getUniquePointer(m_bvh);
			trimeshData->m_quantizedFloatBvh = 0;
#else
			trimeshData->m_quantizedFloatBvh  = (btQuantizedBvhData*)serializer->getUniquePointer(m_bvh);
			trimeshData->m_quantizedDoubleBvh= 0;
#endif //BT_USE_DOUBLE_PRECISION
	
			int sz = m_bvh->calculateSerializeBufferSizeNew();
			btChunk* chunk = serializer->allocate(sz,1);
			const char* structType = m_bvh->serialize(chunk->m_oldPtr, serializer);
			serializer->finalizeChunk(chunk,structType,BT_QUANTIZED_BVH_CODE,m_bvh);
		}
	} else
	{
		trimeshData->m_quantizedFloatBvh = 0;
		trimeshData->m_quantizedDoubleBvh = 0;
	}

	

	if (m_triangleInfoMap && !(serializer->getSerializationFlags()&BT_SERIALIZE_NO_TRIANGLEINFOMAP))
	{
		void* chunk = serializer->findPointer(m_triangleInfoMap);
		if (chunk)
		{
			trimeshData->m_triangleInfoMap = (btTriangleInfoMapData*)chunk;
		} else
		{
			trimeshData->m_triangleInfoMap = (btTriangleInfoMapData*)serializer->getUniquePointer(m_triangleInfoMap);
			int sz = m_triangleInfoMap->calculateSerializeBufferSize();
			btChunk* chunk = serializer->allocate(sz,1);
			const char* structType = m_triangleInfoMap->serialize(chunk->m_oldPtr, serializer);
			serializer->finalizeChunk(chunk,structType,BT_TRIANLGE_INFO_MAP,m_triangleInfoMap);
		}
	} else
	{
		trimeshData->m_triangleInfoMap = 0;
	}

	return "btTriangleMeshShapeData";
}